

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Induction.cpp
# Opt level: O2

void __thiscall
Inferences::InductionClauseIterator::performInfIntInduction
          (InductionClauseIterator *this,InductionContext *context,bool increasing,
          TermLiteralClause *bound)

{
  Literal *bound1;
  TermLiteralClause *bound1_00;
  bool bVar1;
  Literal *bound2;
  undefined7 in_register_00000011;
  TermLiteralClause *bound2_00;
  Entry *e;
  Entry *local_d8;
  InductionContext local_d0;
  InductionContext local_80;
  
  local_d8 = (Entry *)0x0;
  InductionContext::InductionContext(&local_80,context);
  bound2 = bound->literal;
  bound1 = (Literal *)0x0;
  if ((int)CONCAT71(in_register_00000011,increasing) != 0) {
    bound2 = (Literal *)0x0;
    bound1 = bound->literal;
  }
  bVar1 = notDoneInt(this,&local_80,bound1,bound2,&local_d8);
  InductionContext::~InductionContext(&local_80);
  if (bVar1) {
    performIntInduction(this,context,local_d8,increasing,bound,(TermLiteralClause *)0x0);
  }
  InductionContext::InductionContext(&local_d0,context);
  bound2_00 = bound;
  bound1_00 = (TermLiteralClause *)0x0;
  if (increasing) {
    bound2_00 = (TermLiteralClause *)0x0;
    bound1_00 = bound;
  }
  resolveClauses(this,&local_d0,local_d8,bound1_00,bound2_00);
  InductionContext::~InductionContext(&local_d0);
  return;
}

Assistant:

void InductionClauseIterator::performInfIntInduction(const InductionContext& context, bool increasing, const TermLiteralClause& bound)
{
  InductionFormulaIndex::Entry* e = nullptr;
  if (notDoneInt(context, increasing ? bound.literal : nullptr, increasing ? nullptr : bound.literal, e)) {
    performIntInduction(context, e, increasing, bound, nullptr);
  }
  resolveClauses(context, e, increasing ? &bound : nullptr, increasing ? nullptr : &bound);
}